

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRSDA.cpp
# Opt level: O1

void __thiscall chrono::ChLinkRSDA::ArchiveOUT(ChLinkRSDA *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChCoordsys<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkRSDA>(marchive);
  ChLink::ArchiveOUT(&this->super_ChLink,marchive);
  local_38._value = &this->m_csys1;
  local_38._name = "m_csys1";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChCoordsys<double>>(marchive,&local_38);
  local_38._value = &this->m_csys2;
  local_38._name = "m_csys2";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChCoordsys<double>>(marchive,&local_38);
  return;
}

Assistant:

void ChLinkRSDA::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkRSDA>();

    // serialize parent class
    ChLink::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(m_csys1);
    marchive << CHNVP(m_csys2);
}